

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool __thiscall soul::AST::EndpointDetails::isResolved(EndpointDetails *this)

{
  pool_ref<soul::AST::Expression> *ppVar1;
  size_t sVar2;
  long *plVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  pool_ptr<soul::AST::Expression> local_28;
  
  ppVar1 = (this->dataTypes).items;
  sVar2 = (this->dataTypes).numActive;
  lVar6 = 0;
  while( true ) {
    if (sVar2 << 3 == lVar6) {
      local_28.object = (this->arraySize).object;
      if (local_28.object == (Expression *)0x0) {
        return true;
      }
      bVar5 = isResolvedAsConstant(&local_28);
      return bVar5;
    }
    plVar3 = *(long **)((long)&ppVar1->object + lVar6);
    if ((int)plVar3[5] != 1) break;
    cVar4 = (**(code **)(*plVar3 + 0x18))();
    lVar6 = lVar6 + 8;
    if (cVar4 == '\0') {
      return false;
    }
  }
  return false;
}

Assistant:

bool isResolved() const
        {
            for (auto& t : dataTypes)
                if (! isResolvedAsType (t.get()))
                    return false;

            return arraySize == nullptr || isResolvedAsConstant (arraySize);
        }